

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_tree.cc
# Opt level: O0

void memory_tree_ns::learn(memory_tree *b,single_learner *base,example *ec)

{
  ostream *poVar1;
  void *pvVar2;
  clock_t cVar3;
  size_t sVar4;
  uint32_t *ec_array_index;
  clock_t cVar5;
  memory_tree *in_RSI;
  memory_tree *in_RDI;
  example *in_stack_00000020;
  single_learner *in_stack_00000028;
  memory_tree *in_stack_00000030;
  clock_t begin_1;
  uint32_t i_1;
  size_t ec_id;
  uint32_t i;
  example *new_ec;
  clock_t begin;
  example *in_stack_ffffffffffffff68;
  example *in_stack_ffffffffffffff70;
  single_learner *in_stack_ffffffffffffff78;
  memory_tree *base_00;
  memory_tree *in_stack_ffffffffffffff80;
  v_array<example_*> *in_stack_ffffffffffffff98;
  memory_tree *in_stack_ffffffffffffffa0;
  undefined8 in_stack_ffffffffffffffa8;
  undefined1 fake_insert;
  uint32_t *in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb8;
  uint uVar6;
  undefined4 in_stack_ffffffffffffffbc;
  memory_tree *in_stack_ffffffffffffffc0;
  uint local_34;
  
  fake_insert = (undefined1)((ulong)in_stack_ffffffffffffffa8 >> 0x38);
  if ((in_RDI->test_mode & 1U) == 0) {
    in_RDI->iter = in_RDI->iter + 1;
    predict(in_stack_00000030,in_stack_00000028,in_stack_00000020);
    if (in_RDI->iter % 5000 == 0) {
      if (in_RDI->oas == 0) {
        poVar1 = std::operator<<((ostream *)&std::cout,"at iter ");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_RDI->iter);
        poVar1 = std::operator<<(poVar1,", top(");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_RDI->top_K);
        poVar1 = std::operator<<(poVar1,") pred error: ");
        poVar1 = (ostream *)
                 std::ostream::operator<<
                           (poVar1,((double)in_RDI->num_mistakes * 1.0) / (double)in_RDI->iter);
        poVar1 = std::operator<<(poVar1,", total num queires so far: ");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_RDI->total_num_queries);
        poVar1 = std::operator<<(poVar1,", max depth: ");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_RDI->max_depth);
        poVar1 = std::operator<<(poVar1,", max exp in leaf: ");
        pvVar2 = (void *)std::ostream::operator<<(poVar1,in_RDI->max_ex_in_leaf);
        std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
      }
      else {
        poVar1 = std::operator<<((ostream *)&std::cout,"at iter ");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_RDI->iter);
        poVar1 = std::operator<<(poVar1,", avg hamming loss: ");
        pvVar2 = (void *)std::ostream::operator<<
                                   (poVar1,((double)in_RDI->hamming_loss * 1.0) /
                                           (double)in_RDI->iter);
        std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
      }
    }
    cVar3 = clock();
    if (in_RDI->current_pass == 0) {
      calloc_or_throw<example>();
      copy_example_data(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,0);
      v_array<example_*>::push_back
                ((v_array<example_*> *)in_stack_ffffffffffffff70,
                 (example **)in_stack_ffffffffffffff68);
      if (in_RDI->online == 1) {
        in_stack_ffffffffffffffa0 = in_RDI;
        v_array<example_*>::size(&in_RDI->examples);
        fake_insert = (undefined1)((ulong)in_RSI >> 0x38);
        in_stack_ffffffffffffff98 = &in_RDI->examples;
        sVar4 = v_array<example_*>::size(&in_RDI->examples);
        v_array<example_*>::operator[](in_stack_ffffffffffffff98,sVar4 - 1);
        update_rew(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
                   (uint32_t *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
      }
      v_array<example_*>::size(&in_RDI->examples);
      insert_example(in_stack_ffffffffffffffc0,
                     (single_learner *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8)
                     ,in_stack_ffffffffffffffb0,(bool)fake_insert);
      for (local_34 = 0; local_34 < in_RDI->dream_repeats; local_34 = local_34 + 1) {
        experience_replay(in_stack_ffffffffffffffa0,(single_learner *)in_stack_ffffffffffffff98);
      }
    }
    else {
      ec_array_index = (uint32_t *)(long)in_RDI->iter;
      sVar4 = v_array<example_*>::size(&in_RDI->examples);
      base_00 = in_RDI;
      v_array<example_*>::operator[](&in_RDI->examples,(ulong)ec_array_index % sVar4);
      update_rew(in_RSI,(single_learner *)base_00,ec_array_index,in_stack_ffffffffffffff68);
      for (uVar6 = 0; uVar6 < in_RDI->dream_repeats; uVar6 = uVar6 + 1) {
        experience_replay(in_stack_ffffffffffffffa0,(single_learner *)in_stack_ffffffffffffff98);
      }
    }
    cVar5 = clock();
    in_RDI->construct_time =
         (float)((double)in_RDI->construct_time + (double)(cVar5 - cVar3) / 1000000.0);
  }
  else if ((in_RDI->test_mode & 1U) == 1) {
    in_RDI->iter = in_RDI->iter + 1;
    if (in_RDI->iter % 5000 == 0) {
      if (in_RDI->oas == 0) {
        poVar1 = std::operator<<((ostream *)&std::cout,"at iter ");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_RDI->iter);
        poVar1 = std::operator<<(poVar1,", pred error: ");
        pvVar2 = (void *)std::ostream::operator<<
                                   (poVar1,((double)in_RDI->num_mistakes * 1.0) /
                                           (double)in_RDI->iter);
        std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
      }
      else {
        poVar1 = std::operator<<((ostream *)&std::cout,"at iter ");
        poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_RDI->iter);
        poVar1 = std::operator<<(poVar1,", avg hamming loss: ");
        pvVar2 = (void *)std::ostream::operator<<
                                   (poVar1,((double)in_RDI->hamming_loss * 1.0) /
                                           (double)in_RDI->iter);
        std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
      }
    }
    cVar3 = clock();
    predict(in_stack_00000030,in_stack_00000028,in_stack_00000020);
    cVar5 = clock();
    in_RDI->test_time = (float)((double)in_RDI->test_time + (double)(cVar5 - cVar3) / 1000000.0);
  }
  return;
}

Assistant:

void learn(memory_tree& b, single_learner& base, example& ec)
    {        
        if (b.test_mode == false){
            b.iter++;
            predict(b, base, ec);
            
            if (b.iter%5000 == 0){
                if (b.oas == false)
	                cout<<"at iter "<<b.iter<<", top("<<b.top_K<<") pred error: "<<b.num_mistakes*1./b.iter<<", total num queires so far: "<<b.total_num_queries<<", max depth: "<<b.max_depth<<", max exp in leaf: "<<b.max_ex_in_leaf<<endl;
                else
                    cout<<"at iter "<<b.iter<<", avg hamming loss: "<<b.hamming_loss*1./b.iter<<endl;
            }

            clock_t begin = clock();
        
            if (b.current_pass < 1){ //in the first pass, we need to store the memory:
                example* new_ec = &calloc_or_throw<example>();
                copy_example_data(new_ec, &ec, b.oas);
                b.examples.push_back(new_ec);   
                if(b.online == true)
                    update_rew(b, base, b.examples.size() - 1,*b.examples[b.examples.size()-1]); //query and learn
                
                insert_example(b, base, b.examples.size() - 1); //unsupervised learning. 
                for (uint32_t i = 0; i < b.dream_repeats; i++)
                    experience_replay(b, base);
            }
            else{ //starting from the current pass, we just learn using reinforcement signal, no insertion needed:
                size_t ec_id = (b.iter)%b.examples.size();
                update_rew(b, base, ec_id, *b.examples[ec_id]); //no insertion will happen in this call
		        for (uint32_t i = 0; i < b.dream_repeats; i++)
		            experience_replay(b, base);
            }
            b.construct_time += double(clock() - begin)/CLOCKS_PER_SEC;   
        }
        else if (b.test_mode == true){
            b.iter++;
            if (b.iter % 5000 == 0){
                if(b.oas == false)
                    cout<<"at iter "<<b.iter<<", pred error: "<<b.num_mistakes*1./b.iter<<endl;
                else
                    cout<<"at iter "<<b.iter<<", avg hamming loss: "<<b.hamming_loss*1./b.iter<<endl;
            }
            clock_t begin = clock();
            predict(b, base, ec);
            b.test_time += double(clock() - begin)/CLOCKS_PER_SEC;
        }

    }